

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int archive_read_support_format_xar(archive *_a)

{
  int iVar1;
  void *format_data;
  int magic_test;
  int r;
  archive_read *a;
  xar *xar;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_xar");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    format_data = calloc(1,600);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate xar data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined4 *)((long)format_data + 0x1b8) = 0;
      *(undefined4 *)((long)format_data + 0x1bc) = 0;
      *(undefined8 *)((long)format_data + 0x1b0) = 0;
      _a_local._4_4_ =
           __archive_read_register_format
                     ((archive_read *)_a,format_data,"xar",xar_bid,
                      (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,xar_read_header,
                      xar_read_data,xar_read_data_skip,
                      (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,xar_cleanup,
                      (_func_int_archive_read_ptr *)0x0,(_func_int_archive_read_ptr *)0x0);
      if (_a_local._4_4_ != 0) {
        free(format_data);
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_xar(struct archive *_a)
{
	struct xar *xar;
	struct archive_read *a = (struct archive_read *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_xar");

	xar = calloc(1, sizeof(*xar));
	if (xar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate xar data");
		return (ARCHIVE_FATAL);
	}

	/* initialize xar->file_queue */
	xar->file_queue.allocated = 0;
	xar->file_queue.used = 0;
	xar->file_queue.files = NULL;

	r = __archive_read_register_format(a,
	    xar,
	    "xar",
	    xar_bid,
	    NULL,
	    xar_read_header,
	    xar_read_data,
	    xar_read_data_skip,
	    NULL,
	    xar_cleanup,
	    NULL,
	    NULL);
	if (r != ARCHIVE_OK)
		free(xar);
	return (r);
}